

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall QRawFont::setPixelSize(QRawFont *this,qreal pixelSize)

{
  QFontEngine *pQVar1;
  QRawFontPrivate *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  
  pQVar1 = ((this->d).d.ptr)->fontEngine;
  if (pQVar1 != (QFontEngine *)0x0) {
    bVar2 = qFuzzyCompare((pQVar1->fontDef).pixelSize,pixelSize);
    if (!bVar2) {
      QExplicitlySharedDataPointer<QRawFontPrivate>::detach(&this->d);
      this_00 = (this->d).d.ptr;
      iVar3 = (*this_00->fontEngine->_vptr_QFontEngine[0x2e])(pixelSize);
      QRawFontPrivate::setFontEngine(this_00,(QFontEngine *)CONCAT44(extraout_var,iVar3));
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }